

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O2

void glist_selectall(_glist *x)

{
  t_selection *ptVar1;
  _selection *p_Var2;
  t_gobj *x_00;
  
  if ((x->gl_editor != (t_editor *)0x0) && (glist_noselect(x), x->gl_list != (t_gobj *)0x0)) {
    ptVar1 = (t_selection *)getbytes(0x10);
    x_00 = x->gl_list;
    x->gl_editor->e_selection = ptVar1;
    ptVar1->sel_what = x_00;
    gobj_select(x_00,x,1);
    while (x_00 = x_00->g_next, x_00 != (t_gobj *)0x0) {
      p_Var2 = (_selection *)getbytes(0x10);
      ptVar1->sel_next = p_Var2;
      p_Var2->sel_what = x_00;
      gobj_select(x_00,x,1);
      ptVar1 = p_Var2;
    }
    ptVar1->sel_next = (_selection *)0x0;
  }
  return;
}

Assistant:

void glist_selectall(t_glist *x)
{
    if (x->gl_editor)
    {
        glist_noselect(x);
        if (x->gl_list)
        {
            t_selection *sel = (t_selection *)getbytes(sizeof(*sel));
            t_gobj *y = x->gl_list;
            x->gl_editor->e_selection = sel;
            sel->sel_what = y;
            gobj_select(y, x, 1);
            while ((y = y->g_next))
            {
                t_selection *sel2 = (t_selection *)getbytes(sizeof(*sel2));
                sel->sel_next = sel2;
                sel = sel2;
                sel->sel_what = y;
                gobj_select(y, x, 1);
            }
            sel->sel_next = 0;
        }
    }
}